

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

iterator * __thiscall
google::
dense_hashtable<std::pair<std::pair<int,int>const,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
::insert_at<std::pair<int,int>const&,int>
          (iterator *__return_storage_ptr__,
          dense_hashtable<std::pair<std::pair<int,int>const,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
          *this,size_type pos,pair<int,_int> *args,int *args_1)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  length_error *this_00;
  
  lVar2 = *(long *)(this + 0x50);
  if (*(long *)(this + 0x58) - lVar2 != -1) {
    if ((lVar2 == 0) ||
       (iVar1 = *(int *)(*(long *)(this + 0x78) + pos * 0xc),
       *(int *)(this + 0x38) = *(int *)(this + 0x38) + 1, *(int *)(this + 0x3c) != iVar1)) {
      *(long *)(this + 0x58) = *(long *)(this + 0x58) + 1;
    }
    else {
      if (lVar2 != 0) {
        *(int *)(this + 0x38) = *(int *)(this + 0x38) + 1;
      }
      *(long *)(this + 0x50) = lVar2 + -1;
    }
    lVar2 = *(long *)(this + 0x78);
    lVar4 = pos * 0xc;
    *(pair<int,_int> *)(lVar2 + lVar4) = *args;
    *(int *)(lVar2 + 8 + lVar4) = *args_1;
    lVar2 = *(long *)(this + 0x60);
    lVar3 = *(long *)(this + 0x78);
    __return_storage_ptr__->ht =
         (dense_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          *)this;
    __return_storage_ptr__->pos = (pointer)(lVar4 + lVar3);
    __return_storage_ptr__->end = (pointer)(lVar3 + lVar2 * 0xc);
    return __return_storage_ptr__;
  }
  this_00 = (length_error *)__cxa_allocate_exception(0x10);
  std::length_error::length_error(this_00,"insert overflow");
  __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

size_type size() const { return num_elements - num_deleted; }